

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O3

int rawWaveAddGeneric(uint numIn1,rawWave_t *in1)

{
  rawWave_t *prVar1;
  int *piVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  long lVar14;
  ulong uVar15;
  uint32_t uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  uint32_t *puVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  uint32_t uVar28;
  ulong uVar13;
  
  uVar5 = (ulong)(uint)wfcur;
  uVar4 = wfc[uVar5];
  uVar12 = 1 - wfcur;
  uVar13 = (ulong)uVar12;
  if (numIn1 == 0 && uVar4 == 0) {
    bVar27 = true;
    uVar18 = 0;
    uVar19 = 0x416c;
    uVar6 = 0;
    uVar17 = 0;
  }
  else {
    lVar8 = uVar5 * 0x2ee00;
    lVar14 = uVar13 * 0x2ee00;
    uVar9 = -(uint)(uVar4 == 0);
    uVar7 = -(uint)(numIn1 == 0);
    puVar24 = &wf[uVar13][0].flags;
    uVar19 = 0x416c;
    iVar10 = 0;
    uVar20 = 0;
    uVar17 = 0;
    uVar15 = 0;
    uVar18 = 0;
    uVar23 = 0;
    do {
      iVar22 = (int)uVar23;
      uVar21 = uVar17;
      if (uVar7 < uVar9) {
        if (uVar17 < uVar7) {
          piVar2 = (int *)(lVar14 + 0x13b878 + (ulong)(iVar22 - 1) * 0x10);
          *piVar2 = *piVar2 + iVar10 + uVar7;
          uVar21 = uVar7;
        }
        uVar6 = (ulong)in1[uVar20].gpioOn;
        ((rawWave_t *)(puVar24 + -3))->gpioOn = in1[uVar20].gpioOn;
        uVar28 = in1[uVar20].gpioOff;
        puVar24[-2] = uVar28;
        uVar16 = in1[uVar20].flags;
        *puVar24 = uVar16;
        uVar7 = in1[uVar20].usDelay + uVar21;
        uVar20 = (ulong)((int)uVar20 + 1);
      }
      else if (uVar9 < uVar7) {
        if (uVar17 < uVar9) {
          piVar2 = (int *)(lVar14 + 0x13b878 + (ulong)(iVar22 - 1) * 0x10);
          *piVar2 = *piVar2 + iVar10 + uVar9;
          uVar21 = uVar9;
        }
        lVar11 = uVar15 * 0x10;
        uVar17 = wf[uVar5][uVar15].gpioOn;
        uVar6 = (ulong)uVar17;
        ((rawWave_t *)(puVar24 + -3))->gpioOn = uVar17;
        uVar28 = *(uint32_t *)(lVar8 + 0x13b874 + lVar11);
        puVar24[-2] = uVar28;
        uVar16 = *(uint32_t *)(lVar8 + 0x13b87c + lVar11);
        *puVar24 = uVar16;
        uVar9 = *(int *)(lVar8 + 0x13b878 + lVar11) + uVar21;
        uVar15 = (ulong)((int)uVar15 + 1);
      }
      else {
        if (uVar17 < uVar7) {
          piVar2 = (int *)(lVar14 + 0x13b878 + (ulong)(iVar22 - 1) * 0x10);
          *piVar2 = *piVar2 + iVar10 + uVar7;
          uVar21 = uVar7;
        }
        prVar1 = wf[uVar5] + uVar15;
        uVar6._0_4_ = prVar1->gpioOn;
        uVar6._4_4_ = prVar1->gpioOff;
        uVar3._0_4_ = in1[uVar20].gpioOn;
        uVar3._4_4_ = in1[uVar20].gpioOff;
        uVar6 = uVar6 | uVar3;
        ((rawWave_t *)(puVar24 + -3))->gpioOn = (int)uVar6;
        ((rawWave_t *)(puVar24 + -3))->gpioOff = (int)(uVar6 >> 0x20);
        uVar16 = *(uint *)(lVar8 + 0x13b87c + uVar15 * 0x10) | in1[uVar20].flags;
        *puVar24 = uVar16;
        uVar7 = in1[uVar20].usDelay + uVar21;
        uVar20 = (ulong)((int)uVar20 + 1);
        uVar9 = *(int *)(lVar8 + 0x13b878 + uVar15 * 0x10) + uVar21;
        uVar15 = (ulong)((int)uVar15 + 1);
        uVar28 = (uint32_t)(uVar6 >> 0x20);
      }
      uVar17 = uVar9;
      if (uVar7 < uVar9) {
        uVar17 = uVar7;
      }
      iVar10 = 0;
      uVar21 = uVar17 - uVar21;
      puVar24[-1] = uVar21;
      if ((uVar21 != 0) && (iVar10 = 1, 6 < gpioCfg.DMAsecondaryChannel)) {
        iVar10 = ((uVar21 & 0x3fffffff) / 0x3fff + 1) - (uint)(uVar21 * -0x40010004 >> 2 < 0x10005);
      }
      uVar19 = ((int)((uVar16 & 2) << 0x1e) >> 0x1f) + (uVar19 - (uVar16 & 1));
      uVar18 = ((uVar16 & 2) >> 1) + (uVar16 & 1) +
               ((((iVar10 + uVar18) - (uint)((int)uVar6 == 0)) + 2) - (uint)(uVar28 == 0));
      uVar6 = uVar23 + 1;
      bVar25 = numIn1 <= (uint)uVar20;
      if (bVar25) {
        uVar7 = 0xffffffff;
      }
      bVar26 = uVar4 <= (uint)uVar15;
      if (bVar26) {
        uVar9 = 0xffffffff;
      }
      bVar27 = uVar23 < 11999;
      if (bVar26 && bVar25) break;
      iVar10 = -uVar17;
      puVar24 = puVar24 + 4;
      bVar25 = uVar23 < 11999;
      uVar23 = uVar6;
    } while (bVar25);
  }
  uVar4 = 0xffffffdc;
  if ((bVar27) && (uVar9 = (uint)uVar6, uVar9 < uVar19)) {
    if (wfStats_1 < uVar17) {
      wfStats_1 = uVar17;
    }
    if (wfStats_4 < uVar9) {
      wfStats_4 = uVar9;
    }
    if (wfStats_7 < uVar18) {
      wfStats_7 = uVar18;
    }
    wfStats_0 = uVar17;
    wfStats_3 = uVar9;
    wfStats_6 = uVar18;
    wfc[uVar13] = uVar9;
    uVar4 = uVar9;
    wfcur = uVar12;
  }
  return uVar4;
}

Assistant:

int rawWaveAddGeneric(unsigned numIn1, rawWave_t *in1)
{
   unsigned inPos1=0, inPos2=0, outPos=0, level = NUM_WAVE_OOL;

   unsigned cbs=0;

   unsigned numIn2, numOut;

   uint32_t tNow, tNext1, tNext2, tDelay;

   rawWave_t *in2, *out;

   numIn2 = wfc[wfcur];
   in2    = wf[wfcur];

   numOut = PI_WAVE_MAX_PULSES;
   out   = wf[1-wfcur];

   tNow = 0;

   if (!numIn1) tNext1 = -1; else tNext1 = 0;
   if (!numIn2) tNext2 = -1; else tNext2 = 0;

   while (((inPos1<numIn1) || (inPos2<numIn2)) && (outPos<numOut))
   {
      if (tNext1 < tNext2)
      {
         /* pulse 1 due */

         if (tNow < tNext1)
         {
            /* extend previous delay */
            out[outPos-1].usDelay += (tNext1 - tNow);
            tNow = tNext1;
         }

         out[outPos].gpioOn  = in1[inPos1].gpioOn;
         out[outPos].gpioOff = in1[inPos1].gpioOff;
         out[outPos].flags   = in1[inPos1].flags;

         tNext1 = tNow + in1[inPos1].usDelay; ++inPos1;
      }
      else if (tNext2 < tNext1)
      {
         /* pulse 2 due */

         if (tNow < tNext2)
         {
            /* extend previous delay */
            out[outPos-1].usDelay += (tNext2 - tNow);
            tNow = tNext2;
         }

         out[outPos].gpioOn  = in2[inPos2].gpioOn;
         out[outPos].gpioOff = in2[inPos2].gpioOff;
         out[outPos].flags   = in2[inPos2].flags;

         tNext2 = tNow + in2[inPos2].usDelay; ++inPos2;
      }
      else
      {
         /* pulse 1 and 2 both due */

         if (tNow < tNext1)
         {
            /* extend previous delay */
            out[outPos-1].usDelay += (tNext1 - tNow);
            tNow = tNext1;
         }

         out[outPos].gpioOn  = in1[inPos1].gpioOn  | in2[inPos2].gpioOn;
         out[outPos].gpioOff = in1[inPos1].gpioOff | in2[inPos2].gpioOff;
         out[outPos].flags   = in1[inPos1].flags   | in2[inPos2].flags;

         tNext1 = tNow + in1[inPos1].usDelay; ++inPos1;
         tNext2 = tNow + in2[inPos2].usDelay; ++inPos2;
      }

      if (tNext1 <= tNext2) { tDelay = tNext1 - tNow; tNow = tNext1; }
      else                  { tDelay = tNext2 - tNow; tNow = tNext2; }

      out[outPos].usDelay = tDelay;

      cbs += waveDelayCBs(tDelay);

      if (out[outPos].gpioOn) cbs++; /* one cb if gpio on */

      if (out[outPos].gpioOff) cbs++; /* one cb if gpio off */

      if (out[outPos].flags & WAVE_FLAG_READ)
      {
         cbs++; /* one cb if read */
         --level;
      }

      if (out[outPos].flags & WAVE_FLAG_TICK)
      {
         cbs++; /* one cb if tick */
         --level;
      }

      outPos++;

      if (inPos1 >= numIn1) tNext1 = -1;
      if (inPos2 >= numIn2) tNext2 = -1;

   }

   if ((outPos < numOut) && (outPos < level))
   {
      wfStats.micros = tNow;

      if (tNow > wfStats.highMicros) wfStats.highMicros = tNow;

      wfStats.pulses = outPos;

      if (outPos > wfStats.highPulses) wfStats.highPulses = outPos;

      wfStats.cbs    = cbs;

      if (cbs > wfStats.highCbs) wfStats.highCbs = cbs;

      wfc[1-wfcur] = outPos;
      wfcur = 1 - wfcur;

      return outPos;
   }
   else return PI_TOO_MANY_PULSES;
}